

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDB_DBIStream.cpp
# Opt level: O3

ErrorCode __thiscall PDB::DBIStream::HasValidPublicSymbolStream(DBIStream *this,RawFile *file)

{
  ErrorCode EVar1;
  ErrorCode EVar2;
  HashTableHeader data;
  DirectMSFStream publicStream;
  undefined1 local_40 [16];
  DirectMSFStream local_30;
  
  RawFile::CreateMSFStream<PDB::DirectMSFStream>
            (&local_30,file,(uint)(this->m_header).publicStreamIndex);
  DirectMSFStream::ReadAtOffset(&local_30,local_40,0x10,0x1c);
  EVar2 = UnknownVersion;
  if (SUB84(local_40._0_8_,4) == 0xf12f091a) {
    EVar2 = Success;
  }
  EVar1 = InvalidSignature;
  if ((uint32_t)local_40._0_8_ == 0xffffffff) {
    EVar1 = EVar2;
  }
  return EVar1;
}

Assistant:

PDB_NO_DISCARD PDB::ErrorCode PDB::DBIStream::HasValidPublicSymbolStream(const RawFile& file) const PDB_NO_EXCEPT
{
	DirectMSFStream publicStream = file.CreateMSFStream<DirectMSFStream>(m_header.publicStreamIndex);

	// the public symbol stream always begins with a header, we are not interested in that.
	// following the public symbol stream header is a hash table header.
	const HashTableHeader hashHeader = publicStream.ReadAtOffset<HashTableHeader>(sizeof(PublicStreamHeader));
	if (hashHeader.signature != HashTableHeader::Signature)
	{
		return ErrorCode::InvalidSignature;
	}
	else if (hashHeader.version != HashTableHeader::Version)
	{
		return ErrorCode::UnknownVersion;
	}

	return ErrorCode::Success;
}